

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_transcoder.cpp
# Opt level: O0

void basist::convert_etc1s_to_pvrtc2_rgb(void *pDst,endpoint *pEndpoints,selector *pSelector)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  byte bVar6;
  byte bVar7;
  char cVar8;
  char cVar9;
  char cVar10;
  char cVar11;
  char cVar12;
  char cVar13;
  char cVar14;
  char cVar15;
  char cVar16;
  int iVar17;
  uint uVar18;
  long lVar19;
  long lVar20;
  long lVar21;
  byte *in_RDX;
  byte *in_RSI;
  byte *in_RDI;
  bool bVar22;
  uint32_t x_shift_3;
  uint32_t x_shift_2;
  uint32_t x_shift_1;
  uint32_t x_shift;
  uint32_t sels3;
  uint32_t sels2;
  uint32_t sels1;
  uint32_t sels0;
  uint32_t sel_bits3;
  uint32_t sel_bits2;
  uint32_t sel_bits1;
  uint32_t sel_bits0;
  uint8_t *pSelectors_xlat;
  uint32_t total_err_9;
  uint32_t total_err_8;
  uint32_t total_err_7;
  uint32_t total_err_6;
  uint32_t total_err_5;
  uint32_t total_err_4;
  uint32_t total_err_3;
  uint32_t total_err_2;
  uint32_t total_err_1;
  uint32_t total_err;
  uint32_t best_mapping;
  uint32_t best_err;
  etc1s_to_atc_solution *pTable_b;
  etc1s_to_atc_solution *pTable_g;
  etc1s_to_atc_solution *pTable_r;
  uint32_t selector_range_table;
  uint32_t b1;
  uint32_t g1;
  uint32_t r1;
  uint32_t b0;
  uint32_t g0;
  uint32_t r0;
  color32 block_colors [4];
  uint32_t b;
  uint32_t g;
  uint32_t r;
  uint32_t inten_table;
  color32 *base_color;
  uint32_t high_selector;
  uint32_t low_selector;
  pvrtc2_block *pBlock;
  undefined8 in_stack_fffffffffffffef0;
  uint32_t uVar23;
  undefined8 in_stack_fffffffffffffef8;
  pvrtc2_block *ppVar24;
  pvrtc2_block *in_stack_ffffffffffffff00;
  pvrtc2_block *this;
  pvrtc2_block *this_00;
  undefined4 in_stack_ffffffffffffff08;
  undefined4 in_stack_ffffffffffffff0c;
  undefined4 in_stack_ffffffffffffff10;
  undefined4 in_stack_ffffffffffffff14;
  uint32_t in_stack_ffffffffffffff18;
  uint32_t in_stack_ffffffffffffff1c;
  undefined4 in_stack_ffffffffffffff20;
  undefined4 in_stack_ffffffffffffff24;
  uint32_t in_stack_ffffffffffffff34;
  color32 *in_stack_ffffffffffffff38;
  undefined4 in_stack_ffffffffffffff40;
  undefined4 in_stack_ffffffffffffff44;
  uint local_98;
  uint local_94;
  pvrtc2_block local_58 [2];
  pvrtc2_block apStack_48 [2];
  uint local_34;
  uint local_28;
  uint local_24;
  byte *local_20;
  byte *local_18;
  
  *(uint *)(in_RDI + 4) = *(uint *)(in_RDI + 4) & 0xffff7fff | 0x8000;
  *(uint *)(in_RDI + 4) = *(uint *)(in_RDI + 4) & 0xfffffffe;
  *(uint *)(in_RDI + 4) = *(uint *)(in_RDI + 4) & 0x7fffffff | 0x80000000;
  local_24 = (uint)in_RDX[8];
  local_28 = (uint)in_RDX[9];
  local_34 = (uint)in_RSI[4];
  uVar23 = (uint32_t)((ulong)in_stack_fffffffffffffef0 >> 0x20);
  local_20 = in_RDI;
  if (local_24 == local_28) {
    decoder_etc_block::get_block_color5
              ((color32 *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
               in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18,
               (uint32_t *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
               (uint32_t *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),
               (uint32_t *)in_stack_ffffffffffffff00);
    pvrtc2_block::set_low_color
              (in_stack_ffffffffffffff00,(uint32_t)((ulong)in_stack_fffffffffffffef8 >> 0x20),
               (uint32_t)in_stack_fffffffffffffef8,uVar23);
    pvrtc2_block::set_high_color
              (in_stack_ffffffffffffff00,(uint32_t)((ulong)in_stack_fffffffffffffef8 >> 0x20),
               (uint32_t)in_stack_fffffffffffffef8,uVar23);
    *local_20 = 0x55;
    local_20[1] = 0x55;
    local_20[2] = 0x55;
    local_20[3] = 0x55;
  }
  else {
    local_18 = in_RDX;
    if ((((local_34 < 7) || (in_RDX[10] != 2)) || (in_RDX[8] != 0)) || (in_RDX[9] != 3)) {
      iVar17 = *(int *)(g_etc1s_to_atc_selector_range_index +
                       (ulong)local_28 * 4 + (ulong)local_24 * 0x10);
      lVar19 = (ulong)((local_34 * 0x20 + (uint)*in_RSI) * 0x3c + iVar17 * 10) * 4;
      lVar20 = (ulong)((local_34 * 0x20 + (uint)in_RSI[1]) * 0x3c + iVar17 * 10) * 4;
      lVar21 = (ulong)((local_34 * 0x20 + (uint)in_RSI[2]) * 0x3c + iVar17 * 10) * 4;
      local_94 = 0xffffffff;
      uVar18 = (uint)*(ushort *)(g_etc1s_to_atc_55 + lVar19 + 2) +
               (uint)*(ushort *)(g_etc1s_to_atc_55 + lVar20 + 2) +
               (uint)*(ushort *)(g_etc1s_to_pvrtc2_45 + lVar21 + 2);
      if (uVar18 != 0xffffffff) {
        local_94 = uVar18;
      }
      uVar18 = (uint)*(ushort *)(g_etc1s_to_atc_55 + lVar19 + 6) +
               (uint)*(ushort *)(g_etc1s_to_atc_55 + lVar20 + 6) +
               (uint)*(ushort *)(g_etc1s_to_pvrtc2_45 + lVar21 + 6);
      bVar22 = uVar18 < local_94;
      if (bVar22) {
        local_94 = uVar18;
      }
      local_98 = (uint)bVar22;
      uVar18 = (uint)*(ushort *)(g_etc1s_to_atc_55 + lVar19 + 10) +
               (uint)*(ushort *)(g_etc1s_to_atc_55 + lVar20 + 10) +
               (uint)*(ushort *)(g_etc1s_to_pvrtc2_45 + lVar21 + 10);
      if (uVar18 < local_94) {
        local_98 = 2;
        local_94 = uVar18;
      }
      uVar18 = (uint)*(ushort *)(g_etc1s_to_atc_55 + lVar19 + 0xe) +
               (uint)*(ushort *)(g_etc1s_to_atc_55 + lVar20 + 0xe) +
               (uint)*(ushort *)(g_etc1s_to_pvrtc2_45 + lVar21 + 0xe);
      if (uVar18 < local_94) {
        local_98 = 3;
        local_94 = uVar18;
      }
      uVar18 = (uint)*(ushort *)(g_etc1s_to_atc_55 + lVar19 + 0x12) +
               (uint)*(ushort *)(g_etc1s_to_atc_55 + lVar20 + 0x12) +
               (uint)*(ushort *)(g_etc1s_to_pvrtc2_45 + lVar21 + 0x12);
      if (uVar18 < local_94) {
        local_98 = 4;
        local_94 = uVar18;
      }
      uVar18 = (uint)*(ushort *)(g_etc1s_to_atc_55 + lVar19 + 0x16) +
               (uint)*(ushort *)(g_etc1s_to_atc_55 + lVar20 + 0x16) +
               (uint)*(ushort *)(g_etc1s_to_pvrtc2_45 + lVar21 + 0x16);
      if (uVar18 < local_94) {
        local_98 = 5;
        local_94 = uVar18;
      }
      uVar18 = (uint)*(ushort *)(g_etc1s_to_atc_55 + lVar19 + 0x1a) +
               (uint)*(ushort *)(g_etc1s_to_atc_55 + lVar20 + 0x1a) +
               (uint)*(ushort *)(g_etc1s_to_pvrtc2_45 + lVar21 + 0x1a);
      if (uVar18 < local_94) {
        local_98 = 6;
        local_94 = uVar18;
      }
      uVar18 = (uint)*(ushort *)(g_etc1s_to_atc_55 + lVar19 + 0x1e) +
               (uint)*(ushort *)(g_etc1s_to_atc_55 + lVar20 + 0x1e) +
               (uint)*(ushort *)(g_etc1s_to_pvrtc2_45 + lVar21 + 0x1e);
      if (uVar18 < local_94) {
        local_98 = 7;
        local_94 = uVar18;
      }
      uVar18 = (uint)*(ushort *)(g_etc1s_to_atc_55 + lVar19 + 0x22) +
               (uint)*(ushort *)(g_etc1s_to_atc_55 + lVar20 + 0x22) +
               (uint)*(ushort *)(g_etc1s_to_pvrtc2_45 + lVar21 + 0x22);
      if (uVar18 < local_94) {
        local_98 = 8;
        local_94 = uVar18;
      }
      if ((uint)*(ushort *)(g_etc1s_to_atc_55 + lVar19 + 0x26) +
          (uint)*(ushort *)(g_etc1s_to_atc_55 + lVar20 + 0x26) +
          (uint)*(ushort *)(g_etc1s_to_pvrtc2_45 + lVar21 + 0x26) < local_94) {
        local_98 = 9;
      }
      pvrtc2_block::set_low_color
                (in_stack_ffffffffffffff00,(uint32_t)((ulong)in_stack_fffffffffffffef8 >> 0x20),
                 (uint32_t)in_stack_fffffffffffffef8,uVar23);
      pvrtc2_block::set_high_color
                (in_stack_ffffffffffffff00,(uint32_t)((ulong)in_stack_fffffffffffffef8 >> 0x20),
                 (uint32_t)in_stack_fffffffffffffef8,uVar23);
      if (local_98 == 6) {
        *local_20 = *local_18;
        local_20[1] = local_18[1];
        local_20[2] = local_18[2];
        local_20[3] = local_18[3];
      }
      else {
        bVar1 = *local_18;
        bVar2 = local_18[1];
        bVar3 = local_18[2];
        bVar4 = local_18[3];
        bVar5 = g_etc1s_to_atc_selector_mappings[(ulong)(bVar2 & 3) + (ulong)local_98 * 4];
        bVar6 = g_etc1s_to_atc_selector_mappings[(ulong)(bVar3 & 3) + (ulong)local_98 * 4];
        bVar7 = g_etc1s_to_atc_selector_mappings[(ulong)(bVar4 & 3) + (ulong)local_98 * 4];
        cVar8 = g_etc1s_to_atc_selector_mappings[(ulong)(bVar2 >> 2 & 3) + (ulong)local_98 * 4];
        cVar9 = g_etc1s_to_atc_selector_mappings[(ulong)(bVar3 >> 2 & 3) + (ulong)local_98 * 4];
        cVar10 = g_etc1s_to_atc_selector_mappings[(ulong)(bVar4 >> 2 & 3) + (ulong)local_98 * 4];
        cVar11 = g_etc1s_to_atc_selector_mappings[(ulong)(bVar2 >> 4 & 3) + (ulong)local_98 * 4];
        cVar12 = g_etc1s_to_atc_selector_mappings[(ulong)(bVar3 >> 4 & 3) + (ulong)local_98 * 4];
        cVar13 = g_etc1s_to_atc_selector_mappings[(ulong)(bVar4 >> 4 & 3) + (ulong)local_98 * 4];
        cVar14 = g_etc1s_to_atc_selector_mappings[(ulong)(bVar2 >> 6) + (ulong)local_98 * 4];
        cVar15 = g_etc1s_to_atc_selector_mappings[(ulong)(bVar3 >> 6) + (ulong)local_98 * 4];
        cVar16 = g_etc1s_to_atc_selector_mappings[(ulong)(bVar4 >> 6) + (ulong)local_98 * 4];
        *local_20 = g_etc1s_to_atc_selector_mappings[(ulong)(bVar1 >> 6) + (ulong)local_98 * 4] << 6
                    | g_etc1s_to_atc_selector_mappings
                      [(ulong)(bVar1 >> 4 & 3) + (ulong)local_98 * 4] << 4 |
                      g_etc1s_to_atc_selector_mappings
                      [(ulong)(bVar1 >> 2 & 3) + (ulong)local_98 * 4] << 2 |
                      g_etc1s_to_atc_selector_mappings[(ulong)(bVar1 & 3) + (ulong)local_98 * 4];
        local_20[1] = cVar14 << 6 | cVar11 << 4 | cVar8 << 2 | bVar5;
        local_20[2] = cVar15 << 6 | cVar12 << 4 | cVar9 << 2 | bVar6;
        local_20[3] = cVar16 << 6 | cVar13 << 4 | cVar10 << 2 | bVar7;
      }
    }
    else {
      ppVar24 = apStack_48;
      this_00 = local_58;
      do {
        this = this_00;
        color32::color32((color32 *)this);
        this_00 = (pvrtc2_block *)&this->field_1;
      } while (this_00 != ppVar24);
      decoder_etc_block::get_block_colors5
                ((color32 *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                 in_stack_ffffffffffffff38,in_stack_ffffffffffffff34);
      uVar23 = (uint32_t)((ulong)this >> 0x20);
      pvrtc2_block::set_low_color
                (this_00,(uint32_t)((ulong)ppVar24 >> 0x20),(uint32_t)ppVar24,uVar23);
      pvrtc2_block::set_high_color
                (this_00,(uint32_t)((ulong)ppVar24 >> 0x20),(uint32_t)ppVar24,uVar23);
      *local_20 = *local_18;
      local_20[1] = local_18[1];
      local_20[2] = local_18[2];
      local_20[3] = local_18[3];
    }
  }
  return;
}

Assistant:

static void convert_etc1s_to_pvrtc2_rgb(void* pDst, const endpoint* pEndpoints, const selector* pSelector)
	{
		pvrtc2_block* pBlock = static_cast<pvrtc2_block*>(pDst);

		pBlock->m_opaque_color_data.m_hard_flag = 1;
		pBlock->m_opaque_color_data.m_mod_flag = 0;
		pBlock->m_opaque_color_data.m_opaque_flag = 1;

		const uint32_t low_selector = pSelector->m_lo_selector;
		const uint32_t high_selector = pSelector->m_hi_selector;

		const color32& base_color = pEndpoints->m_color5;
		const uint32_t inten_table = pEndpoints->m_inten5;

		if (low_selector == high_selector)
		{
			uint32_t r, g, b;
			decoder_etc_block::get_block_color5(base_color, inten_table, low_selector, r, g, b);

			pBlock->set_low_color(g_atc_match55_equals_1[r].m_lo, g_atc_match55_equals_1[g].m_lo, g_pvrtc2_match45_equals_1[b].m_lo);
			pBlock->set_high_color(g_atc_match55_equals_1[r].m_hi, g_atc_match55_equals_1[g].m_hi, g_pvrtc2_match45_equals_1[b].m_hi);

			pBlock->m_modulation[0] = 0x55;
			pBlock->m_modulation[1] = 0x55;
			pBlock->m_modulation[2] = 0x55;
			pBlock->m_modulation[3] = 0x55;

			return;
		}
		else if ((inten_table >= 7) && (pSelector->m_num_unique_selectors == 2) && (pSelector->m_lo_selector == 0) && (pSelector->m_hi_selector == 3))
		{
			color32 block_colors[4];
			decoder_etc_block::get_block_colors5(block_colors, base_color, inten_table);

			const uint32_t r0 = block_colors[0].r;
			const uint32_t g0 = block_colors[0].g;
			const uint32_t b0 = block_colors[0].b;

			const uint32_t r1 = block_colors[3].r;
			const uint32_t g1 = block_colors[3].g;
			const uint32_t b1 = block_colors[3].b;

			pBlock->set_low_color(g_atc_match5[r0].m_hi, g_atc_match5[g0].m_hi, g_pvrtc2_match4[b0].m_hi);
			pBlock->set_high_color(g_atc_match5[r1].m_hi, g_atc_match5[g1].m_hi, g_atc_match5[b1].m_hi);

			pBlock->m_modulation[0] = pSelector->m_selectors[0];
			pBlock->m_modulation[1] = pSelector->m_selectors[1];
			pBlock->m_modulation[2] = pSelector->m_selectors[2];
			pBlock->m_modulation[3] = pSelector->m_selectors[3];

			return;
		}

		const uint32_t selector_range_table = g_etc1s_to_atc_selector_range_index[low_selector][high_selector];

		//[32][8][RANGES][MAPPING]
		const etc1s_to_atc_solution* pTable_r = &g_etc1s_to_atc_55[(inten_table * 32 + base_color.r) * (NUM_ETC1S_TO_ATC_SELECTOR_RANGES * NUM_ETC1S_TO_ATC_SELECTOR_MAPPINGS) + selector_range_table * NUM_ETC1S_TO_ATC_SELECTOR_MAPPINGS];
		const etc1s_to_atc_solution* pTable_g = &g_etc1s_to_atc_55[(inten_table * 32 + base_color.g) * (NUM_ETC1S_TO_ATC_SELECTOR_RANGES * NUM_ETC1S_TO_ATC_SELECTOR_MAPPINGS) + selector_range_table * NUM_ETC1S_TO_ATC_SELECTOR_MAPPINGS];
		const etc1s_to_atc_solution* pTable_b = &g_etc1s_to_pvrtc2_45[(inten_table * 32 + base_color.b) * (NUM_ETC1S_TO_ATC_SELECTOR_RANGES * NUM_ETC1S_TO_ATC_SELECTOR_MAPPINGS) + selector_range_table * NUM_ETC1S_TO_ATC_SELECTOR_MAPPINGS];

		uint32_t best_err = UINT_MAX;
		uint32_t best_mapping = 0;

		assert(NUM_ETC1S_TO_ATC_SELECTOR_MAPPINGS == 10);
#define DO_ITER(m) { uint32_t total_err = pTable_r[m].m_err + pTable_g[m].m_err + pTable_b[m].m_err; if (total_err < best_err) { best_err = total_err; best_mapping = m; } }
		DO_ITER(0); DO_ITER(1); DO_ITER(2); DO_ITER(3); DO_ITER(4);
		DO_ITER(5); DO_ITER(6); DO_ITER(7); DO_ITER(8); DO_ITER(9);
#undef DO_ITER

		pBlock->set_low_color(pTable_r[best_mapping].m_lo, pTable_g[best_mapping].m_lo, pTable_b[best_mapping].m_lo);
		pBlock->set_high_color(pTable_r[best_mapping].m_hi, pTable_g[best_mapping].m_hi, pTable_b[best_mapping].m_hi);

		if (ATC_IDENTITY_SELECTOR_MAPPING_INDEX == best_mapping)
		{
			pBlock->m_modulation[0] = pSelector->m_selectors[0];
			pBlock->m_modulation[1] = pSelector->m_selectors[1];
			pBlock->m_modulation[2] = pSelector->m_selectors[2];
			pBlock->m_modulation[3] = pSelector->m_selectors[3];
		}
		else
		{
			// TODO: We could make this faster using several precomputed 256 entry tables, like ETC1S->BC1 does.
			const uint8_t* pSelectors_xlat = &g_etc1s_to_atc_selector_mappings[best_mapping][0];

			const uint32_t sel_bits0 = pSelector->m_selectors[0];
			const uint32_t sel_bits1 = pSelector->m_selectors[1];
			const uint32_t sel_bits2 = pSelector->m_selectors[2];
			const uint32_t sel_bits3 = pSelector->m_selectors[3];

			uint32_t sels0 = 0, sels1 = 0, sels2 = 0, sels3 = 0;

#define DO_X(x) { \
			const uint32_t x_shift = (x) * 2; \
			sels0 |= (pSelectors_xlat[(sel_bits0 >> x_shift) & 3] << x_shift); \
			sels1 |= (pSelectors_xlat[(sel_bits1 >> x_shift) & 3] << x_shift); \
			sels2 |= (pSelectors_xlat[(sel_bits2 >> x_shift) & 3] << x_shift); \
			sels3 |= (pSelectors_xlat[(sel_bits3 >> x_shift) & 3] << x_shift); }

			DO_X(0);
			DO_X(1);
			DO_X(2);
			DO_X(3);
#undef DO_X

			pBlock->m_modulation[0] = (uint8_t)sels0;
			pBlock->m_modulation[1] = (uint8_t)sels1;
			pBlock->m_modulation[2] = (uint8_t)sels2;
			pBlock->m_modulation[3] = (uint8_t)sels3;
		}
	}